

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Vta(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pAig;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  Abs_Par_t Pars;
  Abs_Par_t local_b8;
  
  Abs_ParSetDefaults(&local_b8);
  Extra_UtilGetoptReset();
LAB_002947d6:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"FSPCLDETRAtradvh"), iVar3 = globalUtilOptind,
        0x60 < iVar1) {
    if (iVar1 < 0x72) {
      if (iVar1 == 0x61) {
        local_b8.fAddLayer = local_b8.fAddLayer ^ 1;
      }
      else {
        if (iVar1 != 100) goto switchD_002947fc_caseD_42;
        local_b8.fDumpVabs = local_b8.fDumpVabs ^ 1;
      }
    }
    else if (iVar1 == 0x72) {
      local_b8.fUseRollback = local_b8.fUseRollback ^ 1;
    }
    else if (iVar1 == 0x74) {
      local_b8.fUseTermVars = local_b8.fUseTermVars ^ 1;
    }
    else {
      if (iVar1 != 0x76) goto switchD_002947fc_caseD_42;
      local_b8.fVerbose = local_b8.fVerbose ^ 1;
    }
  }
  switch(iVar1) {
  case 0x41:
    if (globalUtilOptind < argc) {
      local_b8.pFileVabs = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002947d6;
    }
    pcVar5 = "Command line switch \"-A\" should be followed by a file name.\n";
    break;
  case 0x42:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x51:
    goto switchD_002947fc_caseD_42;
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
      break;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_b8.nConfLimit = uVar2;
LAB_0029495b:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
switchD_002947fc_caseD_42:
      Abc_Print(-2,"usage: &vta [-FSPCLDETR num] [-A file] [-tradvh]\n");
      Abc_Print(-2,"\t          variable-time-frame gate-level proof- and cex-based abstraction\n");
      Abc_Print(-2,"\t-F num  : the max number of timeframes to unroll [default = %d]\n",
                (ulong)(uint)local_b8.nFramesMax);
      Abc_Print(-2,"\t-S num  : the starting time frame (0=unused) [default = %d]\n",
                (ulong)(uint)local_b8.nFramesStart);
      Abc_Print(-2,"\t-P num  : the number of previous frames for UNSAT core [default = %d]\n",
                (ulong)(uint)local_b8.nFramesPast);
      Abc_Print(-2,"\t-C num  : the max number of SAT solver conflicts (0=unused) [default = %d]\n",
                (ulong)(uint)local_b8.nConfLimit);
      Abc_Print(-2,
                "\t-L num  : the max number of learned clauses to keep (0=unused) [default = %d]\n",
                (ulong)(uint)local_b8.nLearnedStart);
      Abc_Print(-2,"\t-D num  : delta value for learned clause removal [default = %d]\n",
                (ulong)(uint)local_b8.nLearnedDelta);
      Abc_Print(-2,"\t-E num  : ratio percentage for learned clause removal [default = %d]\n",
                (ulong)(uint)local_b8.nLearnedPerce);
      Abc_Print(-2,"\t-T num  : an approximate timeout, in seconds [default = %d]\n",
                (ulong)(uint)local_b8.nTimeOut);
      Abc_Print(-2,
                "\t-R num  : minimum percentage of abstracted objects (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)local_b8.nRatioMin);
      Abc_Print(-2,"\t-A file : file name for dumping abstrated model [default = \"vabs.aig\"]\n");
      pcVar4 = "yes";
      pcVar5 = "yes";
      if (local_b8.fUseTermVars == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-t      : toggle using terminal variables [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_b8.fUseRollback == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-r      : toggle using rollback after the starting frames [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (local_b8.fAddLayer == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-a      : toggle refinement by adding one layers of gates [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (local_b8.fDumpVabs == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-d      : toggle dumping abstracted model into a file [default = %s]\n",pcVar5
               );
      if (local_b8.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
    goto LAB_002947d6;
  case 0x44:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b8.nLearnedDelta = uVar2;
      goto LAB_0029495b;
    }
    pcVar5 = "Command line switch \"-D\" should be followed by an integer.\n";
    break;
  case 0x45:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b8.nLearnedPerce = uVar2;
      goto LAB_0029495b;
    }
    pcVar5 = "Command line switch \"-E\" should be followed by an integer.\n";
    break;
  case 0x46:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b8.nFramesMax = uVar2;
      goto LAB_0029495b;
    }
    pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b8.nLearnedStart = uVar2;
      goto LAB_0029495b;
    }
    pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b8.nFramesPast = uVar2;
      goto LAB_0029495b;
    }
    pcVar5 = "Command line switch \"-P\" should be followed by an integer.\n";
    break;
  case 0x52:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b8.nRatioMin = uVar2;
      goto LAB_0029495b;
    }
    pcVar5 = "Command line switch \"-R\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b8.nFramesStart = uVar2;
      goto LAB_0029495b;
    }
    pcVar5 = "Command line switch \"-S\" should be followed by an integer.\n";
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_b8.nTimeOut = uVar2;
      goto LAB_0029495b;
    }
    pcVar5 = "Command line switch \"-T\" should be followed by an integer.\n";
    break;
  default:
    if (iVar1 == -1) {
      pAig = pAbc->pGia;
      if (pAig == (Gia_Man_t *)0x0) {
        pcVar5 = "Abc_CommandAbc9Dc2(): There is no AIG.\n";
      }
      else {
        if (pAig->nRegs != 0) {
          if (pAig->vCos->nSize - pAig->nRegs < 2) {
            if (local_b8.nFramesMax < 0) {
              pcVar5 = "The number of starting frames should be a positive integer.\n";
            }
            else {
              if ((local_b8.nFramesMax == 0) || (local_b8.nFramesStart <= local_b8.nFramesMax)) {
                iVar3 = Gia_VtaPerform(pAig,&local_b8);
                pAbc->Status = iVar3;
                pAbc->nFrames = local_b8.iFrame;
                Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
                return 0;
              }
              pcVar5 = "The starting frame is larger than the max number of frames.\n";
            }
          }
          else {
            pcVar5 = "The network is more than one PO (run \"orpos\").\n";
          }
          iVar3 = 1;
          goto LAB_00294c57;
        }
        pcVar5 = "Abc_CommandAbc9Era(): The network is combinational.\n";
      }
      pcVar5 = pcVar5 + 0x16;
      iVar3 = -1;
LAB_00294c57:
      Abc_Print(iVar3,pcVar5);
      return 0;
    }
    goto switchD_002947fc_caseD_42;
  }
  Abc_Print(-1,pcVar5);
  goto switchD_002947fc_caseD_42;
}

Assistant:

int Abc_CommandAbc9Vta( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abs_Par_t Pars, * pPars = &Pars;
    int c;
    Abs_ParSetDefaults( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FSPCLDETRAtradvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesStart < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesPast = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesPast < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimit < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedStart < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedDelta < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-E\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedPerce = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedPerce < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMin < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pFileVabs = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 't':
            pPars->fUseTermVars ^= 1;
            break;
        case 'r':
            pPars->fUseRollback ^= 1;
            break;
        case 'a':
            pPars->fAddLayer ^= 1;
            break;
        case 'd':
            pPars->fDumpVabs ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( Gia_ManPoNum(pAbc->pGia) > 1 )
    {
        Abc_Print( 1, "The network is more than one PO (run \"orpos\").\n" );
        return 0;
    }
    if ( pPars->nFramesMax < 0 )
    {
        Abc_Print( 1, "The number of starting frames should be a positive integer.\n" );
        return 0;
    }
    if ( pPars->nFramesMax && pPars->nFramesStart > pPars->nFramesMax )
    {
        Abc_Print( 1, "The starting frame is larger than the max number of frames.\n" );
        return 0;
    }
    pAbc->Status  = Gia_VtaPerform( pAbc->pGia, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &vta [-FSPCLDETR num] [-A file] [-tradvh]\n" );
    Abc_Print( -2, "\t          variable-time-frame gate-level proof- and cex-based abstraction\n" );
    Abc_Print( -2, "\t-F num  : the max number of timeframes to unroll [default = %d]\n", pPars->nFramesMax );
    Abc_Print( -2, "\t-S num  : the starting time frame (0=unused) [default = %d]\n", pPars->nFramesStart );
    Abc_Print( -2, "\t-P num  : the number of previous frames for UNSAT core [default = %d]\n", pPars->nFramesPast );
    Abc_Print( -2, "\t-C num  : the max number of SAT solver conflicts (0=unused) [default = %d]\n", pPars->nConfLimit );
    Abc_Print( -2, "\t-L num  : the max number of learned clauses to keep (0=unused) [default = %d]\n", pPars->nLearnedStart );
    Abc_Print( -2, "\t-D num  : delta value for learned clause removal [default = %d]\n", pPars->nLearnedDelta );
    Abc_Print( -2, "\t-E num  : ratio percentage for learned clause removal [default = %d]\n", pPars->nLearnedPerce );
    Abc_Print( -2, "\t-T num  : an approximate timeout, in seconds [default = %d]\n", pPars->nTimeOut );
    Abc_Print( -2, "\t-R num  : minimum percentage of abstracted objects (0<=num<=100) [default = %d]\n", pPars->nRatioMin );
    Abc_Print( -2, "\t-A file : file name for dumping abstrated model [default = \"vabs.aig\"]\n" );
    Abc_Print( -2, "\t-t      : toggle using terminal variables [default = %s]\n", pPars->fUseTermVars? "yes": "no" );
    Abc_Print( -2, "\t-r      : toggle using rollback after the starting frames [default = %s]\n", pPars->fUseRollback? "yes": "no" );
    Abc_Print( -2, "\t-a      : toggle refinement by adding one layers of gates [default = %s]\n", pPars->fAddLayer? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggle dumping abstracted model into a file [default = %s]\n", pPars->fDumpVabs? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}